

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

ssize_t __thiscall
serial::Serial::SerialImpl::write(SerialImpl *this,int __fd,void *__buf,size_t __n)

{
  uint __i;
  int iVar1;
  int64_t iVar2;
  long lVar3;
  ssize_t sVar4;
  int *piVar5;
  SerialException *this_00;
  IOException *pIVar6;
  PortNotOpenedException *this_01;
  undefined4 in_register_00000034;
  void *pvVar7;
  byte bVar8;
  allocator<char> local_119;
  long local_118;
  timespec timeout;
  MillisecondTimer total_timeout;
  string local_f0;
  string local_d0;
  fd_set writefds;
  
  local_118 = CONCAT44(in_register_00000034,__fd);
  if (this->is_open_ == false) {
    this_01 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_01,"Serial::write");
    __cxa_throw(this_01,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  MillisecondTimer::MillisecondTimer
            (&total_timeout,
             (this->timeout_).write_timeout_multiplier * (int)__buf +
             (this->timeout_).write_timeout_constant);
  bVar8 = 1;
  pvVar7 = (void *)0x0;
  do {
    if ((__buf < pvVar7 || (long)__buf - (long)pvVar7 == 0) ||
       (iVar2 = MillisecondTimer::remaining(&total_timeout), (bool)(~bVar8 & iVar2 < 1))) {
      return (ssize_t)pvVar7;
    }
    timeout = timespec_from_ms((uint32_t)iVar2);
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      writefds.fds_bits[lVar3] = 0;
    }
    iVar1 = this->fd_;
    writefds.fds_bits[iVar1 / 0x40] = writefds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    iVar1 = pselect(iVar1 + 1,(fd_set *)0x0,(fd_set *)&writefds,(fd_set *)0x0,(timespec *)&timeout,
                    (__sigset_t *)0x0);
    if (iVar1 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                   ,&local_119);
        IOException::IOException(pIVar6,&local_d0,0x28a,*piVar5);
        __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
      }
    }
    else {
      if (iVar1 == 0) {
        return (ssize_t)pvVar7;
      }
      iVar1 = this->fd_;
      if (((ulong)writefds.fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) == 0) {
LAB_00109e7d:
        pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                   ,&local_119);
        IOException::IOException
                  (pIVar6,&local_f0,0x2b3,
                   "select reports ready to write, but our fd isn\'t in the list, this shouldn\'t happen!"
                  );
        __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
      }
      sVar4 = ::write(iVar1,(void *)(local_118 + (long)pvVar7),(long)__buf - (long)pvVar7);
      if (sVar4 < 1) {
        this_00 = (SerialException *)__cxa_allocate_exception(0x28);
        SerialException::SerialException
                  (this_00,
                   "device reports readiness to write but returned no data (device disconnected?)");
LAB_00109e67:
        __cxa_throw(this_00,&SerialException::typeinfo,SerialException::~SerialException);
      }
      pvVar7 = (void *)((long)pvVar7 + sVar4);
      if (pvVar7 == __buf) {
        return (ssize_t)__buf;
      }
      if (__buf <= pvVar7) {
        if (pvVar7 <= __buf) goto LAB_00109e7d;
        this_00 = (SerialException *)__cxa_allocate_exception(0x28);
        SerialException::SerialException
                  (this_00,
                   "write over wrote, too many bytes where written, this shouldn\'t happen, might be a logical error!"
                  );
        goto LAB_00109e67;
      }
    }
    bVar8 = 0;
  } while( true );
}

Assistant:

size_t
Serial::SerialImpl::write (const uint8_t *data, size_t length)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::write");
  }
  fd_set writefds;
  size_t bytes_written = 0;

  // Calculate total timeout in milliseconds t_c + (t_m * N)
  long total_timeout_ms = timeout_.write_timeout_constant;
  total_timeout_ms += timeout_.write_timeout_multiplier * static_cast<long> (length);
  MillisecondTimer total_timeout(total_timeout_ms);

  bool first_iteration = true;
  while (bytes_written < length) {
    int64_t timeout_remaining_ms = total_timeout.remaining();
    // Only consider the timeout if it's not the first iteration of the loop
    // otherwise a timeout of 0 won't be allowed through
    if (!first_iteration && (timeout_remaining_ms <= 0)) {
      // Timed out
      break;
    }
    first_iteration = false;

    timespec timeout(timespec_from_ms(timeout_remaining_ms));

    FD_ZERO (&writefds);
    FD_SET (fd_, &writefds);

    // Do the select
    int r = pselect (fd_ + 1, NULL, &writefds, NULL, &timeout, NULL);

    // Figure out what happened by looking at select's response 'r'
    /** Error **/
    if (r < 0) {
      // Select was interrupted, try again
      if (errno == EINTR) {
        continue;
      }
      // Otherwise there was some error
      THROW (IOException, errno);
    }
    /** Timeout **/
    if (r == 0) {
      break;
    }
    /** Port ready to write **/
    if (r > 0) {
      // Make sure our file descriptor is in the ready to write list
      if (FD_ISSET (fd_, &writefds)) {
        // This will write some
        ssize_t bytes_written_now =
          ::write (fd_, data + bytes_written, length - bytes_written);
        // write should always return some data as select reported it was
        // ready to write when we get to this point.
        if (bytes_written_now < 1) {
          // Disconnected devices, at least on Linux, show the
          // behavior that they are always ready to write immediately
          // but writing returns nothing.
          throw SerialException ("device reports readiness to write but "
                                 "returned no data (device disconnected?)");
        }
        // Update bytes_written
        bytes_written += static_cast<size_t> (bytes_written_now);
        // If bytes_written == size then we have written everything we need to
        if (bytes_written == length) {
          break;
        }
        // If bytes_written < size then we have more to write
        if (bytes_written < length) {
          continue;
        }
        // If bytes_written > size then we have over written, which shouldn't happen
        if (bytes_written > length) {
          throw SerialException ("write over wrote, too many bytes where "
                                 "written, this shouldn't happen, might be "
                                 "a logical error!");
        }
      }
      // This shouldn't happen, if r > 0 our fd has to be in the list!
      THROW (IOException, "select reports ready to write, but our fd isn't"
                          " in the list, this shouldn't happen!");
    }
  }
  return bytes_written;
}